

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineMultisampleStateCreateInfo>
          (Impl *this,VkPipelineMultisampleStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineMultisampleStateCreateInfo *pVVar1;
  void *pvVar2;
  VkBool32 VVar3;
  VkBool32 VVar4;
  VkPipelineMultisampleStateCreateFlags VVar5;
  VkSampleCountFlagBits VVar6;
  VkBool32 VVar7;
  float fVar8;
  VkStructureType VVar9;
  undefined4 uVar10;
  bool bVar11;
  VkPipelineMultisampleStateCreateInfo *pVVar12;
  bool bVar13;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar13 = true;
  if (pVVar1 != (VkPipelineMultisampleStateCreateInfo *)0x0) {
    pVVar12 = (VkPipelineMultisampleStateCreateInfo *)
              ScratchAllocator::allocate_raw(alloc,0x30,0x10);
    if (pVVar12 != (VkPipelineMultisampleStateCreateInfo *)0x0) {
      VVar9 = pVVar1->sType;
      uVar10 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      VVar5 = pVVar1->flags;
      VVar6 = pVVar1->rasterizationSamples;
      VVar7 = pVVar1->sampleShadingEnable;
      fVar8 = pVVar1->minSampleShading;
      VVar3 = pVVar1->alphaToCoverageEnable;
      VVar4 = pVVar1->alphaToOneEnable;
      pVVar12->pSampleMask = pVVar1->pSampleMask;
      pVVar12->alphaToCoverageEnable = VVar3;
      pVVar12->alphaToOneEnable = VVar4;
      pVVar12->flags = VVar5;
      pVVar12->rasterizationSamples = VVar6;
      pVVar12->sampleShadingEnable = VVar7;
      pVVar12->minSampleShading = fVar8;
      pVVar12->sType = VVar9;
      *(undefined4 *)&pVVar12->field_0x4 = uVar10;
      pVVar12->pNext = pvVar2;
    }
    *sub_info = pVVar12;
    local_38 = (void *)0x0;
    bVar11 = copy_pnext_chain(this,pVVar12->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar11) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar13 = false;
    }
  }
  return bVar13;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}